

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printfcpp.cpp
# Opt level: O0

int CoreVsnprintf(CPalThread *pthrCurrent,LPSTR Buffer,size_t Count,LPCSTR Format,
                 __va_list_tag *aparg)

{
  long lVar1;
  void *pvVar2;
  char *__s;
  FILE *pFVar3;
  undefined8 uVar4;
  BOOL BVar5;
  int iVar6;
  DWORD DVar7;
  int iVar8;
  size_t sVar9;
  int *piVar10;
  long in_FS_OFFSET;
  undefined4 *local_6b8;
  undefined4 *local_6a0;
  undefined8 *local_688;
  undefined4 *local_670;
  undefined8 *local_658;
  undefined8 *local_638;
  INT *local_618;
  INT *local_600;
  undefined4 *local_5e0;
  undefined8 *local_580;
  INT *local_550;
  INT *local_520;
  undefined1 auStack_508 [8];
  va_list apcopy;
  short s;
  int n;
  short trunc2;
  long trunc1;
  size_t TempCount;
  char *tempStr;
  undefined1 uStack_4b8;
  char ch [2];
  CHAR TempBuffer [5];
  va_list ap;
  int local_490;
  int wctombResult;
  INT TempInt;
  INT Length;
  INT Type;
  INT Prefix;
  INT Precision;
  INT Width;
  INT Flags;
  WCHAR TempWChar;
  LPSTR TempStr;
  LPWSTR TempWStr;
  LPCSTR Fmt;
  LPSTR BufferPtr;
  __va_list_tag *p_Stack_448;
  BOOL BufferRanOut;
  __va_list_tag *aparg_local;
  LPCSTR Format_local;
  size_t Count_local;
  LPSTR Buffer_local;
  CPalThread *pthrCurrent_local;
  CHAR local_418 [8];
  CHAR TempBuff [1024];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  BufferPtr._4_4_ = 0;
  pvVar2 = aparg->reg_save_area;
  _uStack_4b8 = aparg->gp_offset;
  TempBuffer._1_4_ = aparg->fp_offset;
  ap[0]._0_8_ = aparg->overflow_arg_area;
  TempWStr = (LPWSTR)Format;
  Fmt = Buffer;
  p_Stack_448 = aparg;
  aparg_local = (__va_list_tag *)Format;
  Format_local = (LPCSTR)Count;
  Count_local = (size_t)Buffer;
  Buffer_local = (LPSTR)pthrCurrent;
  do {
    if ((char)*TempWStr == '\0') {
LAB_0022db34:
      if ((long)((long)Fmt - Count_local) < (long)(int)Format_local) {
        *Fmt = '\0';
      }
      if (BufferPtr._4_4_ == 0) {
        pthrCurrent_local._4_4_ = (int)Fmt - (int)Count_local;
      }
      else {
        piVar10 = __errno_location();
        *piVar10 = 0x22;
        pthrCurrent_local._4_4_ = -1;
      }
LAB_0022db9b:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return pthrCurrent_local._4_4_;
    }
    if ((BufferPtr._4_4_ != 0) || ((long)(int)Format_local <= (long)((long)Fmt - Count_local))) {
      BufferPtr._4_4_ = 1;
      goto LAB_0022db34;
    }
    if (((char)*TempWStr == '%') &&
       (BVar5 = Internal_ExtractFormatA
                          ((CPalThread *)Buffer_local,(LPCSTR *)&TempWStr,local_418,&Precision,
                           &Prefix,&Type,&Length,&TempInt), uVar4 = _uStack_4b8, BVar5 == 1)) {
      if ((Length == 2) && (TempInt == 2)) {
        if (Prefix == -2) {
          if (_uStack_4b8 < 0x29) {
            local_520 = (INT *)((long)(int)_uStack_4b8 + (long)pvVar2);
            _uStack_4b8 = _uStack_4b8 + 8;
          }
          else {
            local_520 = (INT *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          Prefix = *local_520;
        }
        else if (Prefix == -3) {
          if (_uStack_4b8 < 0x29) {
            _uStack_4b8 = _uStack_4b8 + 8;
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
        }
        if (Type == -2) {
          if (_uStack_4b8 < 0x29) {
            local_550 = (INT *)((long)(int)_uStack_4b8 + (long)pvVar2);
            _uStack_4b8 = _uStack_4b8 + 8;
          }
          else {
            local_550 = (INT *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          Type = *local_550;
        }
        else if (Type == -4) {
          if (_uStack_4b8 < 0x29) {
            _uStack_4b8 = _uStack_4b8 + 8;
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
        }
        if (_uStack_4b8 < 0x29) {
          local_580 = (undefined8 *)((long)(int)_uStack_4b8 + (long)pvVar2);
          _uStack_4b8 = _uStack_4b8 + 8;
        }
        else {
          local_580 = (undefined8 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        TempStr = (LPSTR)*local_580;
        iVar6 = WideCharToMultiByte(0,0,(LPCWSTR)TempStr,-1,(LPSTR)0x0,0,(LPCSTR)0x0,(LPBOOL)0x0);
        if (iVar6 == 0) {
          fprintf(_stderr,"] %s %s:%d","CoreVsnprintf",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                  ,0x663);
          pFVar3 = _stderr;
          DVar7 = GetLastError();
          fprintf(pFVar3,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar7);
          pthrCurrent_local._4_4_ = -1;
          goto LAB_0022db9b;
        }
        _Flags = (LPSTR)CorUnix::InternalMalloc((long)iVar6);
        if (_Flags == (LPSTR)0x0) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          CorUnix::CPalThread::SetLastError(8);
          pthrCurrent_local._4_4_ = -1;
          goto LAB_0022db9b;
        }
        if (Type == -3) {
          *_Flags = '\0';
          wctombResult = 0;
        }
        else if ((Type < 1) || (iVar6 + -1 <= Type)) {
          iVar8 = WideCharToMultiByte(0,0,(LPCWSTR)TempStr,-1,_Flags,iVar6,(LPCSTR)0x0,(LPBOOL)0x0);
          if (iVar8 == 0) {
            fprintf(_stderr,"] %s %s:%d","CoreVsnprintf",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                    ,0x68d);
            pFVar3 = _stderr;
            DVar7 = GetLastError();
            fprintf(pFVar3,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar7);
            CorUnix::InternalFree(_Flags);
            pthrCurrent_local._4_4_ = -1;
            goto LAB_0022db9b;
          }
          wctombResult = iVar6 + -1;
        }
        else {
          iVar6 = WideCharToMultiByte(0,0,(LPCWSTR)TempStr,Type,_Flags,iVar6,(LPCSTR)0x0,(LPBOOL)0x0
                                     );
          if (iVar6 == 0) {
            fprintf(_stderr,"] %s %s:%d","CoreVsnprintf",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                    ,0x67d);
            pFVar3 = _stderr;
            DVar7 = GetLastError();
            fprintf(pFVar3,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar7);
            CorUnix::InternalFree(_Flags);
            pthrCurrent_local._4_4_ = -1;
            goto LAB_0022db9b;
          }
          _Flags[iVar6] = '\0';
          wctombResult = Type;
        }
        BVar5 = Internal_AddPaddingA
                          (&Fmt,(int)Format_local - ((int)Fmt - (int)Count_local),_Flags,
                           Prefix - wctombResult,Precision);
        BufferPtr._4_4_ = (uint)((BVar5 != 0 ^ 0xffU) & 1);
        CorUnix::InternalFree(_Flags);
      }
      else if ((Length == 2) && (TempInt == 1)) {
        if ((Prefix == -2) || (Prefix == -3)) {
          if (_uStack_4b8 < 0x29) {
            _uStack_4b8 = _uStack_4b8 + 8;
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
        }
        if ((Type == -2) || (Type == -4)) {
          if (_uStack_4b8 < 0x29) {
            _uStack_4b8 = _uStack_4b8 + 8;
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
        }
        if (_uStack_4b8 < 0x29) {
          local_5e0 = (undefined4 *)((long)(int)_uStack_4b8 + (long)pvVar2);
          _uStack_4b8 = _uStack_4b8 + 8;
        }
        else {
          local_5e0 = (undefined4 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        Width._2_2_ = (undefined2)*local_5e0;
        iVar6 = WideCharToMultiByte(0,0,(LPCWSTR)((long)&Width + 2),1,(LPSTR)((long)&tempStr + 3),5,
                                    (LPCSTR)0x0,(LPBOOL)0x0);
        if (iVar6 == 0) {
          fprintf(_stderr,"] %s %s:%d","CoreVsnprintf",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                  ,0x6b6);
          pFVar3 = _stderr;
          DVar7 = GetLastError();
          fprintf(pFVar3,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar7);
          pthrCurrent_local._4_4_ = -1;
          goto LAB_0022db9b;
        }
        *(undefined1 *)((long)&tempStr + (long)iVar6 + 3) = 0;
        BVar5 = Internal_AddPaddingA
                          (&Fmt,(int)Format_local - ((int)Fmt - (int)Count_local),
                           (LPSTR)((long)&tempStr + 3),Prefix - iVar6,Precision);
        BufferPtr._4_4_ = (uint)((BVar5 != 0 ^ 0xffU) & 1);
      }
      else if (TempInt == 6) {
        if (Prefix == -2) {
          if (_uStack_4b8 < 0x29) {
            local_600 = (INT *)((long)(int)_uStack_4b8 + (long)pvVar2);
            _uStack_4b8 = _uStack_4b8 + 8;
          }
          else {
            local_600 = (INT *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          Prefix = *local_600;
        }
        if (Type == -2) {
          if (_uStack_4b8 < 0x29) {
            local_618 = (INT *)((long)(int)_uStack_4b8 + (long)pvVar2);
            _uStack_4b8 = _uStack_4b8 + 8;
          }
          else {
            local_618 = (INT *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          Type = *local_618;
        }
        if (Length == 1) {
          if (_uStack_4b8 < 0x29) {
            local_638 = (undefined8 *)((long)(int)_uStack_4b8 + (long)pvVar2);
            _uStack_4b8 = _uStack_4b8 + 8;
          }
          else {
            local_638 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          *(short *)*local_638 = (short)Fmt - (short)Count_local;
        }
        else {
          if (_uStack_4b8 < 0x29) {
            local_658 = (undefined8 *)((long)(int)_uStack_4b8 + (long)pvVar2);
            _uStack_4b8 = _uStack_4b8 + 8;
          }
          else {
            local_658 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          *(int *)*local_658 = (int)Fmt - (int)Count_local;
        }
      }
      else if ((TempInt == 1) && ((Precision & 4U) != 0)) {
        if (_uStack_4b8 < 0x29) {
          local_670 = (undefined4 *)((long)(int)_uStack_4b8 + (long)pvVar2);
          _uStack_4b8 = _uStack_4b8 + 8;
        }
        else {
          local_670 = (undefined4 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        tempStr._1_1_ = (undefined1)*local_670;
        tempStr._2_1_ = 0;
        BVar5 = Internal_AddPaddingA
                          (&Fmt,(int)Format_local - ((int)Fmt - (int)Count_local),
                           (LPSTR)((long)&tempStr + 1),Prefix + -1,Precision);
        BufferPtr._4_4_ = (uint)((BVar5 != 0 ^ 0xffU) & 1);
      }
      else if ((TempInt == 2) && ((Precision & 4U) != 0)) {
        if (_uStack_4b8 < 0x29) {
          local_688 = (undefined8 *)((long)(int)_uStack_4b8 + (long)pvVar2);
          _uStack_4b8 = _uStack_4b8 + 8;
        }
        else {
          local_688 = (undefined8 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        __s = (char *)*local_688;
        sVar9 = strlen(__s);
        BVar5 = Internal_AddPaddingA
                          (&Fmt,(int)Format_local - ((int)Fmt - (int)Count_local),__s,
                           Prefix - (int)sVar9,Precision);
        BufferPtr._4_4_ = (uint)((BVar5 != 0 ^ 0xffU) & 1);
      }
      else {
        trunc1 = (long)Format_local - ((long)Fmt - Count_local);
        if (0x40000000 < (ulong)trunc1) {
          trunc1 = 0x40000000;
        }
        if ((TempInt == 5) && (Length == 1)) {
          if (_uStack_4b8 < 0x29) {
            local_6a0 = (undefined4 *)((long)(int)_uStack_4b8 + (long)pvVar2);
            _uStack_4b8 = _uStack_4b8 + 8;
          }
          else {
            local_6a0 = (undefined4 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          local_490 = snprintf(Fmt,trunc1,local_418,(long)(short)*local_6a0);
        }
        else if ((TempInt == 4) && (Length == 1)) {
          if (_uStack_4b8 < 0x29) {
            local_6b8 = (undefined4 *)((long)(int)_uStack_4b8 + (long)pvVar2);
            _uStack_4b8 = _uStack_4b8 + 8;
          }
          else {
            local_6b8 = (undefined4 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          local_490 = snprintf(Fmt,trunc1,local_418,(ulong)(uint)(int)(short)*local_6b8);
        }
        else {
          auStack_508._0_4_ = _uStack_4b8;
          auStack_508[4] = TempBuffer[1];
          auStack_508[5] = TempBuffer[2];
          auStack_508[6] = TempBuffer[3];
          auStack_508[7] = TempBuffer[4];
          apcopy[0].gp_offset = ap[0].gp_offset;
          apcopy[0].fp_offset = ap[0].fp_offset;
          apcopy[0].overflow_arg_area = pvVar2;
          _uStack_4b8 = uVar4;
          local_490 = vsnprintf(Fmt,trunc1,local_418,auStack_508);
          PAL_printf_arg_remover((va_list *)&uStack_4b8,Prefix,Type,TempInt,Length);
        }
        if ((local_490 < 0) || ((ulong)trunc1 <= (ulong)(long)local_490)) {
          BufferPtr._4_4_ = 1;
        }
        else {
          trunc1 = (long)local_490;
        }
        Fmt = Fmt + trunc1;
      }
    }
    else {
      *Fmt = (CHAR)*TempWStr;
      TempWStr = (LPWSTR)((long)TempWStr + 1);
      Fmt = Fmt + 1;
    }
  } while( true );
}

Assistant:

int CoreVsnprintf(CPalThread *pthrCurrent, LPSTR Buffer, size_t Count, LPCSTR Format, va_list aparg)
{
    BOOL BufferRanOut = FALSE;
    CHAR TempBuff[1024]; /* used to hold a single %<foo> format string */
    LPSTR BufferPtr = Buffer;
    LPCSTR Fmt = Format;
    LPWSTR TempWStr;
    LPSTR TempStr;
    WCHAR TempWChar;
    INT Flags;
    INT Width;
    INT Precision;
    INT Prefix;
    INT Type;
    INT Length;
    INT TempInt;
    int wctombResult;
    va_list ap;

    va_copy(ap, aparg);

    while (*Fmt)
    {
        if (BufferRanOut || (BufferPtr - Buffer) >= static_cast<int>(Count)) //Count is assumed to be in the range of int
        {
            BufferRanOut = TRUE;
            break;
        }
        else if(*Fmt == '%' &&
                TRUE == Internal_ExtractFormatA(pthrCurrent, &Fmt, TempBuff, &Flags,
                                                &Width, &Precision,
                                                &Prefix, &Type))
        {
            if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_STRING)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                else if (WIDTH_INVALID == Width)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }
                else if (PRECISION_INVALID == Precision)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWStr = va_arg(ap, LPWSTR);
                Length = WideCharToMultiByte(CP_ACP, 0, TempWStr, -1, 0,
                                             0, 0, 0);
                if (!Length)
                {
                    ASSERT("WideCharToMultiByte failed.  Error is %d\n",
                          GetLastError());
                    va_end(ap);
                    return -1;
                }
                TempStr = (LPSTR) InternalMalloc(Length);
                if (!TempStr)
                {
                    ERROR("InternalMalloc failed\n");
                    pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                    va_end(ap);
                    return -1;
                }
                if (PRECISION_DOT == Precision)
                {
                    /* copy nothing */
                    *TempStr = 0;
                    Length = 0;
                }
                else if (Precision > 0 && Precision < Length - 1)
                {
                    Length = WideCharToMultiByte(CP_ACP, 0, TempWStr,
                                                 Precision, TempStr, Length,
                                                 0, 0);
                    if (!Length)
                    {
                        ASSERT("WideCharToMultiByte failed.  Error is %d\n",
                              GetLastError());
                        InternalFree(TempStr);
                        va_end(ap);
                        return -1;
                    }
                    TempStr[Length] = 0;
                    Length = Precision;
                }
                /* copy everything */
                else
                {
                    wctombResult = WideCharToMultiByte(CP_ACP, 0, TempWStr, -1,
                                                       TempStr, Length, 0, 0);
                    if (!wctombResult)
                    {
                        ASSERT("WideCharToMultiByte failed.  Error is %d\n",
                              GetLastError());
                        InternalFree(TempStr);
                        va_end(ap);
                        return -1;
                    }
                    --Length; /* exclude null char */
                }

                /* do the padding (if needed)*/
                BufferRanOut = !Internal_AddPaddingA(&BufferPtr,
                                                   Count - (BufferPtr - Buffer),
                                                   TempStr,
                                                   Width - Length,
                                                   Flags);

                InternalFree(TempStr);
            }
            else if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_CHAR)
            {
                CHAR TempBuffer[5];

                if (WIDTH_STAR == Width ||
                    WIDTH_INVALID == Width)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }
                if (PRECISION_STAR == Precision ||
                    PRECISION_INVALID == Precision)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWChar = va_arg(ap, int);
                Length = WideCharToMultiByte(CP_ACP, 0, &TempWChar, 1,
                                             TempBuffer, sizeof(TempBuffer),
                                             0, 0);
                if (!Length)
                {
                    ASSERT("WideCharToMultiByte failed.  Error is %d\n",
                          GetLastError());
                    va_end(ap);
                    return -1;
                }
                TempBuffer[Length] = 0;

                /* do the padding (if needed)*/
                BufferRanOut = !Internal_AddPaddingA(&BufferPtr,
                                                   Count - (BufferPtr - Buffer),
                                                   TempBuffer,
                                                   Width - Length,
                                                   Flags);

            }
            /* this places the number of bytes written to the buffer in the
               next arg */
            else if (Type == PFF_TYPE_N)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }

                if (Prefix == PFF_PREFIX_SHORT)
                {
                    *(va_arg(ap, short *)) = BufferPtr - Buffer;
                }
                else
                {
                    *(va_arg(ap, LPLONG)) = BufferPtr - Buffer;
                }
            }
            else if (Type == PFF_TYPE_CHAR && (Flags & PFF_ZERO) != 0)
            {
                // Some versions of sprintf don't support 0-padded chars,
                // so we handle them here.
                char ch[2];

                ch[0] = (char) va_arg(ap, int);
                ch[1] = '\0';
                Length = 1;
                BufferRanOut = !Internal_AddPaddingA(&BufferPtr,
                                           Count - (BufferPtr - Buffer),
                                           ch,
                                           Width - Length,
                                           Flags);
            }
            else if (Type == PFF_TYPE_STRING && (Flags & PFF_ZERO) != 0)
            {
                // Some versions of sprintf don't support 0-padded strings,
                // so we handle them here.
                char *tempStr;

                tempStr = va_arg(ap, char *);
                Length = strlen(tempStr);
                BufferRanOut = !Internal_AddPaddingA(&BufferPtr,
                                           Count - (BufferPtr - Buffer),
                                           tempStr,
                                           Width - Length,
                                           Flags);
            }
            else
            {
                // Types that sprintf can handle
                size_t TempCount = Count - (BufferPtr - Buffer);

#if !HAVE_LARGE_SNPRINTF_SUPPORT
                // Limit TempCount to 0x40000000, which is sufficient
                // for platforms on which snprintf fails for very large
                // sizes.
                if (TempCount > 0x40000000)
                {
                    TempCount = 0x40000000;
                }
#endif  // HAVE_LARGE_SNPRINTF_SUPPORT

                TempInt = 0;
                // %h (short) doesn't seem to be handled properly by local sprintf,
                // so we do the truncation ourselves for some cases.
                if (Type == PFF_TYPE_P && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert from pointer -> int -> short to avoid warnings.
                    long trunc1;
                    short trunc2;

                    trunc1 = va_arg(ap, LONG);
                    trunc2 = (short) trunc1;
                    trunc1 = trunc2;

                    TempInt = snprintf(BufferPtr, TempCount, TempBuff, trunc1);
                }
                else if (Type == PFF_TYPE_INT && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert explicitly from int to short to get
                    // correct sign extension for shorts on all systems.
                    int n;
                    short s;

                    n = va_arg(ap, int);
                    s = (short) n;

                    TempInt = snprintf(BufferPtr, TempCount, TempBuff, s);
                }
                else
                {
                    va_list apcopy;
                    va_copy(apcopy, ap);
                    TempInt = vsnprintf(BufferPtr, TempCount, TempBuff, apcopy);
                    va_end(apcopy);
                    PAL_printf_arg_remover(&ap, Width, Precision, Type, Prefix);
                }

                if (TempInt < 0 || static_cast<size_t>(TempInt) >= TempCount) /* buffer not long enough */
                {
                    BufferPtr += TempCount;
                    BufferRanOut = TRUE;
                }
                else
                {
                    BufferPtr += TempInt;
                }
            }
        }
        else
        {
            *BufferPtr++ = *Fmt++; /* copy regular chars into buffer */
        }
    }

    if (static_cast<int>(Count) > (BufferPtr - Buffer)) //Count is assumed to be in the range of int
    {
        *BufferPtr = 0; /* end the string */
    }

    va_end(ap);

    if (BufferRanOut)
    {
        errno = ERANGE;
        return -1;
    }
    else
    {
        return BufferPtr - Buffer;
    }
}